

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O0

void __thiscall BinHash<IPStatsRecord>::Resize(BinHash<IPStatsRecord> *this,uint newSize)

{
  IPStatsRecord *pIVar1;
  ulong uVar2;
  bool local_41;
  IPStatsRecord *pIStack_40;
  bool stored;
  IPStatsRecord *x;
  IPStatsRecord **ppIStack_30;
  uint i;
  IPStatsRecord **newBins;
  IPStatsRecord **ppIStack_20;
  uint32_t oldSize;
  IPStatsRecord **oldBins;
  BinHash<IPStatsRecord> *pBStack_10;
  uint newSize_local;
  BinHash<IPStatsRecord> *this_local;
  
  ppIStack_20 = this->hashBin;
  newBins._4_4_ = this->tableSize;
  if (newBins._4_4_ < newSize) {
    uVar2 = SUB168(ZEXT416(newSize) * ZEXT816(8),0);
    if (SUB168(ZEXT416(newSize) * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    oldBins._4_4_ = newSize;
    pBStack_10 = this;
    ppIStack_30 = (IPStatsRecord **)operator_new__(uVar2);
    if (ppIStack_30 != (IPStatsRecord **)0x0) {
      this->hashBin = ppIStack_30;
      this->tableSize = oldBins._4_4_;
      memset(this->hashBin,0,(ulong)this->tableSize << 3);
      this->tableCount = 0;
      if (ppIStack_20 != (IPStatsRecord **)0x0) {
        for (x._4_4_ = 0; x._4_4_ < newBins._4_4_; x._4_4_ = x._4_4_ + 1) {
          while (ppIStack_20[x._4_4_] != (IPStatsRecord *)0x0) {
            pIStack_40 = ppIStack_20[x._4_4_];
            local_41 = false;
            ppIStack_20[x._4_4_] = pIStack_40->HashNext;
            DoInsert(this,pIStack_40,false,&local_41);
            pIVar1 = pIStack_40;
            if (((local_41 & 1U) == 0) && (pIStack_40 != (IPStatsRecord *)0x0)) {
              IPStatsRecord::~IPStatsRecord(pIStack_40);
              operator_delete(pIVar1);
            }
          }
        }
        if (ppIStack_20 != (IPStatsRecord **)0x0) {
          operator_delete__(ppIStack_20);
        }
      }
    }
  }
  return;
}

Assistant:

void Resize(unsigned newSize)
    {
        KeyObj ** oldBins = hashBin;
        uint32_t oldSize = tableSize;

        if (oldSize < newSize)
        {
            KeyObj ** newBins = new KeyObj*[newSize];

            if (newBins == NULL)
            {
                /* Cannot allocate memory. Table is unchanged. */
            }
            else
            {
                hashBin = newBins;
                tableSize = newSize;
                memset(hashBin, 0, sizeof(KeyObj *)*tableSize);
                tableCount = 0;

                if (oldBins != NULL)
                {
                    for (unsigned int i = 0; i < oldSize; i++)
                    {
                        while (oldBins[i] != NULL)
                        {
                            KeyObj* x = oldBins[i];
                            bool stored = false;

                            oldBins[i] = x->HashNext;
                            DoInsert(x, false, &stored);
                            if (!stored)
                            {
                                /* This only happens if there was a duplicate in the original table */
                                delete x;
                            }
                        }
                    }
                    
                    delete[] oldBins;
                }
            }
        }
    }